

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow *window,bool write)

{
  int iVar1;
  ImGuiContext *pIVar2;
  undefined7 in_register_00000031;
  
  pIVar2 = GImGui;
  iVar1 = (window->IDStack).Size;
  if ((int)CONCAT71(in_register_00000031,write) == 0) {
    if (iVar1 != (window->DC).StackSizesBackup[0]) {
      __assert_fail("*p == n && \"PushID/PopID or TreeNode/TreePop Mismatch!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x1ad1,"void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow *, bool)");
    }
    if ((window->DC).GroupStack.Size != (int)(window->DC).StackSizesBackup[1]) {
      __assert_fail("*p == n && \"BeginGroup/EndGroup Mismatch!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x1ad2,"void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow *, bool)");
    }
    if ((GImGui->BeginPopupStack).Size != (int)(window->DC).StackSizesBackup[2]) {
      __assert_fail("*p == n && \"BeginMenu/EndMenu or BeginPopup/EndPopup Mismatch!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x1ad6,"void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow *, bool)");
    }
    if ((int)(window->DC).StackSizesBackup[3] < (GImGui->ColorModifiers).Size) {
      __assert_fail("*p >= n && \"PushStyleColor/PopStyleColor Mismatch!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x1ad7,"void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow *, bool)");
    }
    if ((int)(window->DC).StackSizesBackup[4] < (GImGui->StyleModifiers).Size) {
      __assert_fail("*p >= n && \"PushStyleVar/PopStyleVar Mismatch!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x1ad8,"void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow *, bool)");
    }
    if ((int)(window->DC).StackSizesBackup[5] < (GImGui->FontStack).Size) {
      __assert_fail("*p >= n && \"PushFont/PopFont Mismatch!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x1ad9,"void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow *, bool)");
    }
  }
  else {
    (window->DC).StackSizesBackup[0] = (short)iVar1;
    (window->DC).StackSizesBackup[1] = (short)(window->DC).GroupStack.Size;
    (window->DC).StackSizesBackup[2] = (short)(pIVar2->BeginPopupStack).Size;
    (window->DC).StackSizesBackup[3] = (short)(pIVar2->ColorModifiers).Size;
    (window->DC).StackSizesBackup[4] = (short)(pIVar2->StyleModifiers).Size;
    (window->DC).StackSizesBackup[5] = (short)(pIVar2->FontStack).Size;
  }
  return;
}

Assistant:

static void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow* window, bool write)
{
    ImGuiContext& g = *GImGui;
    short* p = &window->DC.StackSizesBackup[0];

    // Window stacks
    // NOT checking: DC.ItemWidth, DC.AllowKeyboardFocus, DC.ButtonRepeat, DC.TextWrapPos (per window) to allow user to conveniently push once and not pop (they are cleared on Begin)
    { int n = window->IDStack.Size;       if (write) *p = (short)n; else IM_ASSERT(*p == n && "PushID/PopID or TreeNode/TreePop Mismatch!");   p++; }    // Too few or too many PopID()/TreePop()
    { int n = window->DC.GroupStack.Size; if (write) *p = (short)n; else IM_ASSERT(*p == n && "BeginGroup/EndGroup Mismatch!");                p++; }    // Too few or too many EndGroup()

    // Global stacks
    // For color, style and font stacks there is an incentive to use Push/Begin/Pop/.../End patterns, so we relax our checks a little to allow them.
    { int n = g.BeginPopupStack.Size;     if (write) *p = (short)n; else IM_ASSERT(*p == n && "BeginMenu/EndMenu or BeginPopup/EndPopup Mismatch!"); p++; }// Too few or too many EndMenu()/EndPopup()
    { int n = g.ColorModifiers.Size;      if (write) *p = (short)n; else IM_ASSERT(*p >= n && "PushStyleColor/PopStyleColor Mismatch!");       p++; }    // Too few or too many PopStyleColor()
    { int n = g.StyleModifiers.Size;      if (write) *p = (short)n; else IM_ASSERT(*p >= n && "PushStyleVar/PopStyleVar Mismatch!");           p++; }    // Too few or too many PopStyleVar()
    { int n = g.FontStack.Size;           if (write) *p = (short)n; else IM_ASSERT(*p >= n && "PushFont/PopFont Mismatch!");                   p++; }    // Too few or too many PopFont()
    IM_ASSERT(p == window->DC.StackSizesBackup + IM_ARRAYSIZE(window->DC.StackSizesBackup));
}